

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_4faa5c::ArrayType::printRight(ArrayType *this,OutputStream *S)

{
  void *pvVar1;
  void *pvVar2;
  Node *this_00;
  StringView SVar3;
  StringView R;
  StringView R_00;
  
  if ((S->CurrentPosition == 0) || (S->Buffer[S->CurrentPosition - 1] != ']')) {
    SVar3.Last = "";
    SVar3.First = " ";
    OutputStream::operator+=(S,SVar3);
  }
  R.Last = "";
  R.First = "[";
  OutputStream::operator+=(S,R);
  pvVar1 = (this->Dimension).First;
  pvVar2 = (this->Dimension).Second;
  if (pvVar1 == (void *)0x0 || pvVar2 == (void *)0x0) {
    if (pvVar2 == (void *)0x0 && pvVar1 != (void *)0x0) {
      this_00 = NodeOrString::asNode(&this->Dimension);
      Node::print(this_00,S);
    }
  }
  else {
    SVar3 = NodeOrString::asString(&this->Dimension);
    OutputStream::operator+=(S,SVar3);
  }
  R_00.Last = "";
  R_00.First = "]";
  OutputStream::operator+=(S,R_00);
  (*this->Base->_vptr_Node[5])(this->Base,S);
  return;
}

Assistant:

void printRight(OutputStream &S) const override {
    if (S.back() != ']')
      S += " ";
    S += "[";
    if (Dimension.isString())
      S += Dimension.asString();
    else if (Dimension.isNode())
      Dimension.asNode()->print(S);
    S += "]";
    Base->printRight(S);
  }